

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O1

char * pp_get_token(void)

{
  int iVar1;
  ushort **ppuVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  
  pcVar5 = (char *)0x0;
  if ((l != -1) && (l != 10)) {
    do {
      readbyte();
      if ((l == -1) || (l == 10)) break;
      ppuVar2 = __ctype_b_loc();
    } while ((*(byte *)((long)*ppuVar2 + (long)c * 2 + 1) & 0x20) != 0);
    ppuVar2 = __ctype_b_loc();
    iVar1 = c;
    pcVar5 = (char *)0x0;
    if (((long)c != -1) && (((*ppuVar2)[c] & 0x2000) == 0)) {
      eline = line;
      iVar4 = 0;
      if (c == 0x22) {
        iVar4 = 0x22;
      }
      ecolumn = column;
      pp_get_token::buf[0] = (char)c;
      pcVar5 = pp_get_token::buf + 1;
      iVar3 = 1;
      do {
        if ((((long)l == -1) || (l == 10)) ||
           ((iVar1 != 0x22 && ((*(byte *)((long)*ppuVar2 + (long)l * 2 + 1) & 0x20) != 0)))) break;
        readbyte();
        if (iVar3 < 0x3ff) {
          *pcVar5 = (char)c;
          pcVar5 = pcVar5 + 1;
          iVar3 = iVar3 + 1;
        }
      } while ((iVar1 != 0x22) || (c != iVar4));
      *pcVar5 = '\0';
      pcVar5 = pp_get_token::buf;
      if (0x3fe < iVar3) {
        ccerr(F,"too long line directive");
      }
    }
  }
  return pcVar5;
}

Assistant:

char* pp_get_token()
{
    static char buf[1024];
    int len = 1;
    int termchar = 0;
    char* p = buf;

    /* end of line reached */
    if (l == '\n' || l == EOF)
        return NULL;

    /* eat up last token's last character */
    readbyte();

    /* skip spaces */
    while (l != '\n' && l != EOF && isspace(c))
        readbyte();

    /* no token */
    if (isspace(c) || c == EOF)
        return NULL;

    eline = line;
    ecolumn = column;

    if (c == '"')
        termchar = '"';

    len = 1;
    *p++ = c;
    while (l != EOF)
    {
        if (l == '\n')
            break;

        if (!termchar && isspace(l))
            break;

        readbyte();
        if (len < 1023)
        {
            *p++ = c;
            ++len;
        }

        if (termchar && c == termchar)
            break;
    }
    *p = 0;

    if (len >= 1023)
        ccerr(F, "too long line directive");

    return buf;
}